

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

size_t __thiscall
CVmObjDate::format_date
          (CVmObjDate *this,char *buf,size_t buflen,char *fmt,size_t fmtlen,CVmDateLocale *lc,
          multicaldate_t *date,int32_t dayno,int32_t daytime,char *tzabbr,int32_t tzofs)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  byte *pbVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  int32_t iVar8;
  size_t __n;
  char *fmt_00;
  size_t sVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  long val;
  byte bVar14;
  byte *pbVar15;
  int *piVar16;
  byte bVar17;
  int ndigits;
  int iVar18;
  size_t sVar19;
  ldiv_t lVar20;
  byte *local_150;
  size_t local_148;
  size_t local_140;
  CVmDateLocale *local_138;
  size_t subfmtl;
  uint local_128;
  int local_124;
  int hh;
  uint local_11c;
  uint local_118;
  int local_114;
  ulong local_110;
  CVmObjDate *local_108;
  byte *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  double local_e0;
  int iy;
  ulong local_d4;
  bignum_t<32> bdn;
  undefined8 local_78 [3];
  bignum_t<32> result;
  bignum_t<32> bdt;
  
  local_140 = 0;
  local_150 = (byte *)buf;
  if (fmtlen != 0) {
    iVar18 = daytime >> 0x1f;
    local_e0 = ((double)(dayno + -0xafa6c) * 24.0 * 60.0 * 60.0 + (double)(daytime / 1000)) -
               (double)(tzofs / 1000);
    local_110 = (ulong)(uint)-tzofs;
    local_114 = daytime % 1000;
    local_e8 = (ulong)(uint)((daytime / 1000) % 0x3c);
    local_f0 = (ulong)(uint)(43199999 < daytime);
    local_118 = (43199999 < daytime) + 2;
    local_f8 = (ulong)(uint)((daytime / 60000) % 0x3c);
    iVar11 = daytime / 3600000 + iVar18;
    local_11c = iVar11 - iVar18;
    uVar7 = (iVar11 + -0xc) - iVar18;
    if (daytime < 46800000) {
      uVar7 = local_11c;
    }
    hh = 0xc;
    if (0x6ddcfe < daytime + 3599999U) {
      hh = uVar7;
    }
    local_124 = dayno + 1;
    local_100 = (byte *)(tzabbr + 1);
    local_148 = buflen;
    local_138 = lc;
    local_108 = this;
    do {
      pbVar4 = local_150;
      sVar19 = local_148;
      if ((fmtlen == 1) || (*fmt != 0x25)) {
        sVar5 = local_140 + 1;
        if (local_148 != 0) {
          *local_150 = *fmt;
LAB_00287e7b:
          local_140 = local_140 + 1;
          local_150 = local_150 + 1;
          pbVar4 = local_150;
          sVar19 = local_148 - 1;
          sVar5 = local_140;
        }
        goto LAB_0028879f;
      }
      fmt = (char *)((byte *)fmt + 1);
      fmtlen = fmtlen - 1;
      if (fmtlen < 2) {
        fmtlen = 1;
        iVar18 = 0;
        bVar17 = 0;
        bVar2 = 0;
        iVar11 = 0;
      }
      else {
        iVar11 = 0;
        bVar2 = 0;
        iVar18 = 0;
        bVar13 = 0;
        while (bVar17 = *fmt, bVar17 != 0x23) {
          bVar3 = false;
LAB_00287de0:
          if ((bVar17 == 0x20) || (bVar14 = bVar17, bVar17 == 0x15)) {
            fmt = (char *)((byte *)fmt + 1);
            fmtlen = fmtlen - 1;
            if (fmtlen < 2) {
              fmtlen = 1;
              goto LAB_00287eba;
            }
            bVar3 = true;
            bVar14 = *fmt;
            bVar13 = bVar17;
          }
          bVar17 = bVar13;
          if (bVar14 == 0x2d) {
            fmt = (char *)((byte *)fmt + 1);
            fmtlen = fmtlen - 1;
            if (fmtlen < 2) {
              bVar2 = 1;
              goto LAB_00287eaf;
            }
            bVar14 = *fmt;
            bVar2 = 1;
            bVar3 = true;
          }
          if (bVar14 == 0x26) {
            fmt = (char *)((byte *)fmt + 1);
            fmtlen = fmtlen - 1;
            iVar18 = 1;
            bVar3 = true;
          }
          if ((!bVar3) || (bVar13 = bVar17, fmtlen < 2)) goto LAB_00287eba;
        }
        fmt = (char *)((byte *)fmt + 1);
        fmtlen = fmtlen - 1;
        if (1 < fmtlen) {
          bVar17 = *fmt;
          iVar11 = 1;
          bVar3 = true;
          goto LAB_00287de0;
        }
        iVar11 = 1;
        bVar17 = bVar13;
LAB_00287eaf:
        fmtlen = 1;
      }
LAB_00287eba:
      bVar13 = *fmt;
      switch(bVar13) {
      case 0x25:
        sVar5 = local_140 + 1;
        if (local_148 != 0) {
          *local_150 = 0x25;
          goto LAB_00287e7b;
        }
        goto LAB_0028879f;
      default:
        if (local_148 == 0) {
          sVar5 = local_140 + 2;
        }
        else {
          *local_150 = 0x25;
          pbVar4 = local_150 + 1;
          sVar19 = local_148 - 1;
          sVar5 = local_140 + 2;
          if (local_148 - 1 != 0) {
            local_150[1] = *fmt;
            pbVar4 = local_150 + 2;
            sVar19 = local_148 - 2;
          }
        }
        goto LAB_0028879f;
      case 0x41:
        uVar7 = (*date->_vptr_multicaldate_t[4])();
        iVar11 = 2;
        goto LAB_0028828f;
      case 0x42:
        uVar12 = (ulong)(date->m_ - 1);
        iVar11 = 0;
        goto LAB_00288738;
      case 0x43:
        uVar12 = (ulong)(uint)(date->y_ / 100);
        break;
      case 0x44:
        iVar11 = 0xb;
        goto LAB_002883ae;
      case 0x45:
      case 0x65:
        uVar1 = date->y_;
        uVar7 = 1 - uVar1;
        if (0 < (int)uVar1) {
          uVar7 = uVar1;
        }
        if ((((bool)(bVar13 == 0x65 & bVar2)) || ((bool)(bVar13 == 0x45 & ~bVar2 & 0 < (int)uVar1)))
           || (((byte)~bVar2 == 0 && (int)uVar1 < 1) && bVar13 == 0x45)) {
          _wrtlistitem((char **)&local_150,&local_148,&local_140,local_138,5,(uint)((int)uVar1 < 1),
                       0);
          local_140 = local_140 + 1;
          if (local_148 != 0) {
            *local_150 = 0x20;
            local_148 = local_148 - 1;
            local_150 = local_150 + 1;
          }
          iVar6 = 1;
          goto LAB_002888f6;
        }
        local_128 = (uint)((int)uVar1 < 1);
        _wrtnum((char **)&local_150,&local_148,&local_140,uVar7,1,iVar11,bVar17,iVar18);
        local_140 = local_140 + 1;
        if (local_148 != 0) {
          *local_150 = 0x20;
          local_148 = local_148 - 1;
          local_150 = local_150 + 1;
        }
        iVar11 = 5;
        uVar12 = (ulong)local_128;
        lc = local_138;
        goto LAB_00288738;
      case 0x46:
        subfmtl = 8;
        fmt_00 = "%Y-%m-%d";
        goto LAB_002883b6;
      case 0x47:
      case 0x67:
        (*date->_vptr_multicaldate_t[6])(date,&iy);
        ndigits = (uint)(*fmt != 0x67) * 2 + 2;
        lc = local_138;
        iVar6 = iy;
        goto LAB_00288796;
      case 0x48:
        uVar12 = (ulong)local_11c;
        break;
      case 0x49:
        uVar12 = (ulong)(uint)hh;
        break;
      case 0x4a:
        piVar16 = (int *)(local_108->super_CVmObject).ext_;
        lVar10 = (long)piVar16[1];
        val = lVar10 + -43200000;
        if (lVar10 < 0x2932e01) {
          val = lVar10;
        }
        bdn.ext[0] = ' ';
        bdn.ext[1] = '\0';
        bdn.ext[4] = '\0';
        CVmObjBigNum::set_int_val(bdn.ext,(ulong)(43200000 < lVar10) + (long)*piVar16);
        bdt.ext[0] = ' ';
        bdt.ext[1] = '\0';
        bdt.ext[4] = '\0';
        CVmObjBigNum::set_int_val(bdt.ext,val);
        bignum_t<32>::operator+=(&bdn,0x1a431f);
        iy = CONCAT22(iy._2_2_,0x20);
        local_d4 = local_d4 & 0xffffffffffffff00;
        CVmObjBigNum::set_int_val((char *)&iy,86400000);
        result.ext[0] = ' ';
        result.ext[1] = '\0';
        result.ext._4_4_ = result.ext._4_4_ & 0xffffff00;
        CVmObjBigNum::compute_quotient_into(result.ext,(char *)0x0,bdt.ext,(char *)&iy);
        local_78[0] = CONCAT44(result.ext._4_4_,CONCAT22(result.ext._2_2_,result.ext._0_2_));
        iy = CONCAT22(iy._2_2_,0x20);
        local_d4 = local_d4 & 0xffffffffffffff00;
        CVmObjBigNum::compute_sum_into((char *)&iy,bdn.ext,(char *)local_78);
        CVmObjBigNum::copy_val(bdn.ext,(char *)&iy,1);
        CVmObjBigNum::cvt_to_string_buf((char *)&iy,0x40,bdn.ext,-1,-1,10,-1,0x10,(char *)0x0,0);
        pbVar4 = local_150;
        __n = (size_t)(ushort)iy;
        sVar19 = local_148 - __n;
        if (local_148 < __n) {
          if (local_148 != 0) {
            piVar16 = (int *)((long)&iy + 2);
LAB_002885bc:
            sVar19 = local_148;
            pbVar4 = local_150;
            memcpy(local_150,piVar16,local_148);
            local_150 = pbVar4 + sVar19;
            local_148 = 0;
          }
        }
        else {
          memcpy(local_150,(void *)((long)&iy + 2),__n);
          local_150 = pbVar4 + __n;
          local_148 = sVar19;
        }
        goto LAB_0028884c;
      case 0x4d:
        uVar12 = local_f8;
        break;
      case 0x4e:
        iVar6 = local_114;
        goto LAB_0028870f;
      case 0x50:
        iVar11 = 4;
        uVar12 = local_f0;
        goto LAB_00288738;
      case 0x52:
        iVar11 = 0xd;
        goto LAB_002883ae;
      case 0x53:
        uVar12 = local_e8;
        break;
      case 0x54:
        iVar11 = 0xe;
        goto LAB_002883ae;
      case 0x55:
        iVar6 = 0;
        goto LAB_0028837c;
      case 0x56:
        iVar6 = (*date->_vptr_multicaldate_t[6])(date,0);
        goto LAB_00288381;
      case 0x57:
        iVar6 = 1;
LAB_0028837c:
        iVar6 = multicaldate_t::weekno(date,iVar6);
LAB_00288381:
        ndigits = 2;
        goto LAB_00288796;
      case 0x58:
        iVar11 = 9;
        goto LAB_002883ae;
      case 0x59:
        iVar6 = date->y_;
        ndigits = 4;
        goto LAB_00288796;
      case 0x5a:
        local_140 = local_140 + 1;
        if (tzofs < 0) {
          uVar7 = (uint)local_110;
          if (local_148 != 0) {
            *local_150 = 0x2d;
            local_148 = local_148 - 1;
            local_150 = local_150 + 1;
          }
        }
        else {
          uVar7 = tzofs;
          if (local_148 != 0) {
            *local_150 = 0x2b;
            local_148 = local_148 - 1;
            local_150 = local_150 + 1;
          }
        }
        _wrtnum((char **)&local_150,&local_148,&local_140,uVar7 / 3600000,2,iVar11,bVar17,iVar18);
        uVar7 = uVar7 / 60000 + ((uVar7 / 60000 & 0xffff) / 0x3c) * -0x3c & 0xffff;
        iVar6 = 2;
        iVar11 = 0;
LAB_002888f6:
        _wrtnum((char **)&local_150,&local_148,&local_140,uVar7,iVar6,iVar11,bVar17,iVar18);
        lc = local_138;
        pbVar4 = local_150;
        sVar19 = local_148;
        sVar5 = local_140;
        goto LAB_0028879f;
      case 0x61:
        uVar7 = (*date->_vptr_multicaldate_t[4])();
        iVar11 = 3;
LAB_0028828f:
        uVar12 = (ulong)uVar7;
        goto LAB_00288738;
      case 0x62:
        iVar11 = 1;
        uVar12 = (ulong)(date->m_ - 1);
        goto LAB_00288738;
      case 99:
        iVar11 = 8;
        goto LAB_002883ae;
      case 100:
        uVar7 = date->d_;
        goto LAB_00288623;
      case 0x6a:
        iy = date->y_;
        local_d4 = 0x100000001;
        iVar8 = caldate_t::dayno((caldate_t *)&iy);
        iVar6 = local_124 - iVar8;
LAB_0028870f:
        ndigits = 3;
        goto LAB_00288796;
      case 0x6d:
        uVar7 = date->m_;
LAB_00288623:
        uVar12 = (ulong)uVar7;
        break;
      case 0x70:
        iVar11 = 4;
        uVar12 = (ulong)local_118;
LAB_00288738:
        iVar18 = (int)uVar12;
        iVar6 = 0;
LAB_0028873a:
        _wrtlistitem((char **)&local_150,&local_148,&local_140,lc,iVar11,iVar18,iVar6);
        pbVar4 = local_150;
        sVar19 = local_148;
        sVar5 = local_140;
        goto LAB_0028879f;
      case 0x72:
        iVar11 = 0xc;
        goto LAB_002883ae;
      case 0x73:
        sprintf((char *)&iy,"%.0lf",SUB84(local_e0,0));
        __n = strlen((char *)&iy);
        pbVar4 = local_150;
        sVar19 = local_148 - __n;
        if (local_148 < __n) {
          if (local_148 != 0) {
            piVar16 = &iy;
            goto LAB_002885bc;
          }
        }
        else {
          memcpy(local_150,&iy,__n);
          local_150 = pbVar4 + __n;
          local_148 = sVar19;
        }
LAB_0028884c:
        lc = local_138;
        pbVar4 = local_150;
        sVar19 = local_148;
        sVar5 = local_140 + __n;
        goto LAB_0028879f;
      case 0x74:
        _wrtnum((char **)&local_150,&local_148,&local_140,date->d_,1,iVar11,bVar17,iVar18);
        iVar11 = date->d_;
        iVar6 = iVar11 % 10;
        iVar18 = iVar6 + -1 + (uint)(9 < iVar11) * 4;
        if (3 < iVar6) {
          iVar18 = 3;
        }
        if (iVar6 == 0) {
          iVar18 = 3;
        }
        if (iVar11 - 0xbU < 9) {
          iVar18 = 3;
        }
        iVar11 = 7;
        iVar6 = 1;
        lc = local_138;
        goto LAB_0028873a;
      case 0x75:
        iVar6 = (*date->_vptr_multicaldate_t[5])();
        goto LAB_00288774;
      case 0x77:
        iVar6 = (*date->_vptr_multicaldate_t[4])();
LAB_00288774:
        ndigits = 1;
        goto LAB_00288796;
      case 0x78:
        iVar11 = 10;
LAB_002883ae:
        fmt_00 = CVmDateLocale::get(lc,&subfmtl,iVar11);
LAB_002883b6:
        sVar19 = local_148;
        pbVar4 = local_150;
        sVar9 = format_date(local_108,(char *)local_150,local_148,fmt_00,subfmtl,lc,date,dayno,
                            daytime,tzabbr,tzofs);
        sVar5 = local_140 + sVar9;
        if (sVar19 < sVar9) {
          local_148 = 0;
          pbVar4 = pbVar4 + sVar19;
          sVar19 = local_148;
        }
        else {
          pbVar4 = pbVar4 + sVar9;
          sVar19 = sVar19 - sVar9;
        }
        goto LAB_0028879f;
      case 0x79:
        lVar20 = ldiv((long)date->y_,100);
        uVar12 = lVar20.rem;
        break;
      case 0x7a:
        bVar17 = *tzabbr;
        pbVar15 = local_100;
        while (pbVar4 = local_150, sVar19 = local_148, sVar5 = local_140, bVar17 != 0) {
          if (local_148 == 0) {
            local_148 = 0;
          }
          else {
            *local_150 = bVar17;
            local_150 = local_150 + 1;
            local_148 = local_148 - 1;
          }
          local_140 = local_140 + 1;
          bVar17 = *pbVar15;
          pbVar15 = pbVar15 + 1;
        }
        goto LAB_0028879f;
      }
      ndigits = 2;
      iVar6 = (int)uVar12;
LAB_00288796:
      _wrtnum((char **)&local_150,&local_148,&local_140,iVar6,ndigits,iVar11,bVar17,iVar18);
      pbVar4 = local_150;
      sVar19 = local_148;
      sVar5 = local_140;
LAB_0028879f:
      local_140 = sVar5;
      local_148 = sVar19;
      local_150 = pbVar4;
      fmt = (char *)((byte *)fmt + 1);
      fmtlen = fmtlen - 1;
      buflen = local_148;
    } while (fmtlen != 0);
  }
  if (buflen != 0) {
    *local_150 = 0;
  }
  return local_140;
}

Assistant:

size_t CVmObjDate::format_date(VMG_ char *buf, size_t buflen,
                               const char *fmt, size_t fmtlen,
                               CVmDateLocale *lc,
                               const multicaldate_t *date,
                               int32_t dayno, int32_t daytime,
                               const char *tzabbr, int32_t tzofs) const
{
    const char *subfmt;
    size_t subfmtl;
    
    /* we haven't written anything to the buffer yet */
    size_t outlen = 0;

    /* scan the format string */
    for ( ; fmtlen != 0 ; ++fmt, --fmtlen)
    {
        if (*fmt == '%' && fmtlen >= 2)
        {
            /* skip the '%' */
            ++fmt, --fmtlen;

            /* parse flags */
            int pound = FALSE;
            int minus = FALSE;
            int roman = FALSE;
            char leadsp = 0;
            for (int found_flag = TRUE ; found_flag && fmtlen >= 2 ; )
            {
                /* assume we won't find another flag on this pass */
                found_flag = FALSE;
                
                /* check for the '#' flag (meaning varies by format code) */
                if (fmtlen >= 2 && *fmt == '#')
                {
                    pound = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }
                
                /* ' ' and '\ ' (replace leading zeros with spaces) */
                if (fmtlen >= 2 && (*fmt == ' ' || *fmt == 0x15))
                {
                    leadsp = *fmt;
                    found_flag = TRUE;
                    ++fmt, --fmtlen;
                }

                /* check for '-' flag */
                if (fmtlen >= 2 && *fmt == '-')
                {
                    minus = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }

                /* check for '&' flag */
                if (fmtlen >= 2 && *fmt == '&')
                {
                    roman = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }
            }

            /* get the format code */
            switch (*fmt)
            {
            case 'a':
                /* abbreviated day name */
                wrtlistitem(LC_WKDY, date->weekday(), FALSE);
                break;

            case 'A':
                /* full day name */
                wrtlistitem(LC_WEEKDAY, date->weekday(), FALSE);
                break;

            case 'd':
                /* two-digit day of month (or one digit with '#') */
                wrtnum(date->d(), 2);
                break;

            case 'j':
                /* day of year 001-366, three digits with leading zeros */
                {
                    /* 
                     *   we can calculate the day of the year by subtracting
                     *   the day number of Jan 1 from the given date (and
                     *   adding 1 to get into range 1-366) 
                     */
                    caldate_t jan1(date->y(), 1, 1);
                    int j = dayno - jan1.dayno() + 1;
                    wrtnum(j, 3);
                }
                break;

            case 'J':
                /* 
                 *   Julian day number (the 4713 BC kind); '#' suppresses the
                 *   fractional part 
                 */
                {
                    /* get the day and time */
                    long dn = get_dayno(), dt = get_daytime();

                    /* if the time is past noon, it's on the next day */
                    if (dt > 12*60*60*1000)
                        dn += 1, dt -= 12*60*60*1000;

                    /* 
                     *   figure the combined date/time value, adjusting the
                     *   day number to the Julian day Epoch 
                     */
                    bignum_t<32> bdn(dn), bdt(dt);
                    bdn += 1721119L;
                    bdn += (bdt / (long)(24*60*60*1000));

                    /* format it and write it */
                    char jbuf[64];
                    bdn.format(jbuf, sizeof(jbuf), -1, 10);
                    wrttstr(jbuf);
                }
                break;

            case 'u':
                /* day of week 1-7 Monday-Sunday (ISO weekday) */
                wrtnum(date->iso_weekday(), 1);
                break;

            case 'w':
                /* day of week 0-6 Sunday-Saturday */
                wrtnum(date->weekday(), 1);
                break;

            case 't':
                /* day of month with ordinal suffix (non-strftime) */
                wrtnum(date->d(), 1);
                wrtlistitem(LC_ORDSUF, ordinal_index(date->d()), TRUE);
                break;

            case 'U':
                /* week number, 00-53, week 1 starting with first Sunday */
                wrtnum(date->weekno(0), 2);
                break;

            case 'W':
                /* week number, 00-53, week 1 starting with first Monday */
                wrtnum(date->weekno(1), 2);
                break;

            case 'V':
                /* ISO-8601:1988 week number of the year */
                wrtnum(date->iso_weekno(0), 2);
                break;

            case 'b':
                /* abbreviated month name */
                wrtlistitem(LC_MON, date->m() - 1, FALSE);
                break;

            case 'B':
                /* full month name */
                wrtlistitem(LC_MONTH, date->m() - 1, FALSE);
                break;

            case 'm':
                /* two-digit month 01-12 (one digit with #) */
                wrtnum(date->m(), 2);
                break;

            case 'C':
                /* two-digit century (e.g., 19 for 1900-1999) */
                wrtnum(date->y() / 100, 2);
                break;

            case 'g':
            case 'G':
                /* ISO-8601:1988 year ('g'=2 digits, 'G'=4 digits) */
                {
                    /* ISO-8601:1988 week number of the year */
                    int iy;
                    date->iso_weekno(&iy);
                    wrtnum(iy, *fmt == 'g' ? 2 : 4);
                }
                break;

            case 'y':
                /* two-digit year */
                wrtnum(ldiv(date->y(), 100).rem, 2);
                break;

            case 'Y':
                /* four-digit year */
                wrtnum(date->y(), 4);
                break;

            case 'e':
            case 'E':
                /* 
                 *   Year with AD/BC era before/after the year number.  For
                 *   'e', the era is always after, or always before on '-'.
                 *   For 'E', the era is AD before/BC after, or reversed on
                 *   '-'. 
                 */
                {
                    /* figure the era: positive years are AD, <=0 are BC */
                    int idx = 0; // assume AD
                    int yy = date->y();
                    if (yy <= 0)
                    {
                        idx = 1; // BC
                        yy = -yy + 1;
                    }

                    /* 
                     *   Figure the display order: "%-e" puts the era first
                     *   in all case; "%E" puts AD first; "%-E" puts BC first
                     */
                    if ((*fmt == 'e' && minus)
                        || (*fmt == 'E' && !minus && idx == 0)
                        || (*fmt == 'E' && minus && idx == 1))
                    {
                        /* era first */
                        wrtlistitem(LC_ERA, idx, FALSE);
                        wrtch(' ');
                        wrtnum(yy, 1);
                    }
                    else
                    {
                        /* year first */
                        wrtnum(yy, 1);
                        wrtch(' ');
                        wrtlistitem(LC_ERA, idx, FALSE);
                    }
                }
                break;

            case 'H':
                /* two-digit hour, 24-hour clock */
                wrtnum(daytime/(60*60*1000), 2);
                break;

            case 'I':
                /* two-digit hour, 12-hour clock */
                {
                    int hh = daytime/(60*60*1000);
                    if (hh == 0)
                        hh = 12;
                    else if (hh >= 13)
                        hh -= 12;

                    wrtnum(hh, 2);
                }
                break;

            case 'M':
                /* two-digit minute */
                wrtnum(daytime/(60*1000) % 60, 2);
                break;

            case 'P':
                /* upper-case AM or PM */
                wrtlistitem(LC_AMPM, daytime/(60*60*1000) >= 12 ? 1 : 0, FALSE);
                break;

            case 'p':
                /* lower-case am or pm */
                wrtlistitem(LC_AMPM, daytime/(60*60*1000) >= 12 ? 3 : 2, FALSE);
                break;

            case 'r':
                /* full 12-hour clock time: %I:%M:%S %P */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_12HOUR);
                goto do_subfmt;

            do_subfmt:
                {
                    /* recursively format the new format string */
                    size_t l = format_date(
                        vmg_ buf, buflen, subfmt, subfmtl, lc,
                        date, dayno, daytime, tzabbr, tzofs);

                    /* count it in our output length */
                    outlen += l;

                    /* advance our buffer pointer past the copied text */
                    if (buflen >= l)
                        buflen -= l, buf += l;
                    else
                        buf += buflen, buflen = 0;
                }
                break;

            case 'R':
                /* 24-hour clock time w/minutes: %H:%M */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_24HOUR);
                goto do_subfmt;

            case 'S':
                /* two-digit seconds */
                wrtnum(daytime/1000 % 60, 2);
                break;

            case 'N':
                /* three-digit milliseconds (non-strftime) */
                wrtnum(daytime % 1000, 3);
                break;

            case 'T':
                /* 24-hour clock time w/seconds: %H:%M:%S */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_24HOURSECS);
                goto do_subfmt;

            case 'X':
                /* locale time representation without the date */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_TIME);
                goto do_subfmt;

            case 'z':
                /* time zone abbreviation */
                {
                    for (const char *p = tzabbr ; *p != '\0' ; ++p)
                        wrtch(*p);
                }
                break;

            case 'Z':
                /* time zone UTC offset, four digits (+0500) */
                {
                    int32_t o = tzofs;
                    if (o < 0)
                        wrtch('-'), o = -o;
                    else
                        wrtch('+');

                    wrtnum(o/(60*60*1000), 2);
                    pound = FALSE;
                    wrtnum(o/(60*1000) % 60, 2);
                }
                break;

            case 'c':
                /* preferred locale date and time stamp */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_TIMESTAMP);
                goto do_subfmt;

            case 'D':
                /* short date - %m/%d/%y */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_SHORTDATE);
                goto do_subfmt;

            case 'F':
                /* database-style date: %Y-%m-%d */
                subfmt = "%Y-%m-%d";
                subfmtl = 8;
                goto do_subfmt;

            case 's':
                /* Unix Epoch timestamp as an integer */
                {
                    /* 
                     *   The Unix timestamp is the number of seconds after
                     *   (or before, if negative) 1/1/1970 00:00 UTC.  First
                     *   calculate the number of days after (before) 1/1/1970
                     *   by subtracting the Unix Epoch day number from our
                     *   internal day number; then multiply that by the
                     *   number of seconds in a day (24*60*60) to get the
                     *   Unix timestamp of midnight on that day, then add the
                     *   number of seconds into the day ('daytime' stores
                     *   milliseconds, so divide it by 1000).
                     *   
                     *   Note that we need to adjust back to UTC by
                     *   subtracting the time zone offset.
                     *   
                     *   As we've discussed elsewhere in this file, a double
                     *   is big enough for the Unix timestamp value for any
                     *   day number we can store, and represents it exactly
                     *   since we're working in whole numbers.
                     */
                    double utime = (dayno - caldate_t::UNIX_EPOCH_DAYNO)
                                   * 24.*60.*60.
                                   + daytime/1000
                                   - tzofs/1000;

                    /* format it to a buffer and copy to the output */
                    char ubuf[60];
                    sprintf(ubuf, "%.0lf", utime);
                    wrtstr(ubuf);
                }
                break;

            case 'x':
                /* preferred locale date representation */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_DATE);
                goto do_subfmt;

            case '%':
                /* a literal % */
                wrtch('%');
                break;

            default:
                /* 
                 *   anything else is an error; copy the whole %x literally
                 *   to make the unparsed format character apparent
                 */
                wrtch('%');
                wrtch(*fmt);
                break;
            }
        }
        else
        {
            /* it's an ordinary character, so copy it literally */
            wrtch(*fmt);
        }
    }

    /* add a nul if there's room (but don't count it in the result length) */
    if (buflen > 0)
        *buf++ = '\0';

    /* return the total space needed */
    return outlen;
}